

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void __thiscall QAbstractAnimationPrivate::setState(QAbstractAnimationPrivate *this,State newState)

{
  QBindingStorage *this_00;
  QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
  *data;
  qsizetype *data_00;
  QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
  *data_01;
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
  *this_01;
  State SVar1;
  int iVar2;
  QObject *obj;
  QBindingStatus *pQVar3;
  QObjectData *pQVar4;
  parameter_type pVar5;
  parameter_type pVar6;
  parameter_type pVar7;
  parameter_type pVar8;
  int iVar9;
  parameter_type pVar10;
  int iVar11;
  ExternalRefCountData *pEVar12;
  long in_FS_OFFSET;
  bool isTopLevel;
  QAbstractAnimation *in_stack_ffffffffffffff58;
  QPropertyData<QAbstractAnimation::State> local_60;
  State local_5c;
  void *local_58;
  State *local_50;
  QPropertyData<QAbstractAnimation::State> *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SVar1 = (this->state).super_QPropertyData<QAbstractAnimation::State>.val;
  if (SVar1 == newState) goto LAB_003a29d5;
  obj = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
  data_01 = &this->loopCount;
  this_00 = &(this->super_QObjectPrivate).super_QObjectData.bindingStorage;
  pQVar3 = (this->super_QObjectPrivate).super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar3 != (QBindingStatus *)0x0) &&
     (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data_01);
  }
  if ((data_01->super_QPropertyData<int>).val == 0) goto LAB_003a29d5;
  data = &this->state;
  iVar2 = this->currentTime;
  pVar5 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
          ::value(&this->currentLoop);
  pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value(&this->direction);
  if (SVar1 == Stopped && newState - Paused < 2) {
    this_01 = &this->totalCurrentTime;
    pVar7 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
            ::value(this_01);
    pVar8 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
            ::value(&this->direction);
    if (pVar8 == Forward) {
      iVar9 = 0;
    }
    else {
      pQVar3 = (this->super_QObjectPrivate).super_QObjectData.bindingStorage.bindingStatus;
      if ((pQVar3 != (QBindingStatus *)0x0) &&
         (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data_01);
      }
      if ((data_01->super_QPropertyData<int>).val == -1) {
        iVar9 = (*obj->_vptr_QObject[0xc])(obj);
      }
      else {
        iVar9 = QAbstractAnimation::totalDuration((QAbstractAnimation *)obj);
      }
    }
    this->currentTime = iVar9;
    QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
    ::setValue(this_01,iVar9);
    pVar10 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
             ::value(this_01);
    if (pVar10 != pVar7) {
      QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
      ::notify(this_01);
    }
  }
  (data->super_QPropertyData<QAbstractAnimation::State>).val = newState;
  if (obj == (QObject *)0x0) {
    pEVar12 = (ExternalRefCountData *)0x0;
  }
  else {
    pEVar12 = QtSharedPointer::ExternalRefCountData::getAndRef(obj);
  }
  if (this->group == (QAnimationGroup *)0x0) {
    isTopLevel = true;
  }
  else {
    pQVar4 = (this->group->super_QAbstractAnimation).super_QObject.d_ptr.d;
    data_00 = &pQVar4[1].children.d.size;
    pQVar3 = (pQVar4->bindingStorage).bindingStatus;
    if ((pQVar3 != (QBindingStatus *)0x0) &&
       (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper
                (&pQVar4->bindingStorage,(QUntypedPropertyData *)data_00);
    }
    isTopLevel = (int)*data_00 == 0;
  }
  if (SVar1 == Running) {
    if ((newState == Paused) && (this->hasRegisteredTimer == true)) {
      QAnimationTimer::ensureTimerUpdate();
    }
    QAnimationTimer::unregisterAnimation(in_stack_ffffffffffffff58);
  }
  else if (newState == Running) {
    QAnimationTimer::registerAnimation((QAbstractAnimation *)obj,isTopLevel);
  }
  (*obj->_vptr_QObject[0xe])(obj,(ulong)newState,(ulong)SVar1);
  if (pEVar12 == (ExternalRefCountData *)0x0) goto LAB_003a29d5;
  if (((pEVar12->strongref)._q_value.super___atomic_base<int>._M_i != 0) &&
     ((data->super_QPropertyData<QAbstractAnimation::State>).val == newState)) {
    QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
    ::notify(data);
    local_50 = &local_5c;
    local_48 = &local_60;
    local_58 = (void *)0x0;
    local_60.val = SVar1;
    local_5c = newState;
    QMetaObject::activate(obj,&QAbstractAnimation::staticMetaObject,1,&local_58);
    if (((pEVar12->strongref)._q_value.super___atomic_base<int>._M_i != 0) &&
       ((data->super_QPropertyData<QAbstractAnimation::State>).val == newState)) {
      pQVar3 = (this->super_QObjectPrivate).super_QObjectData.bindingStorage.bindingStatus;
      if ((pQVar3 != (QBindingStatus *)0x0) &&
         (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
        newState = (data->super_QPropertyData<QAbstractAnimation::State>).val;
      }
      if (newState == Stopped) {
        iVar9 = (*obj->_vptr_QObject[0xc])(obj);
        if (this->deleteWhenStopped == true) {
          QObject::deleteLater(obj);
        }
        if (iVar9 != -1) {
          pQVar3 = (this->super_QObjectPrivate).super_QObjectData.bindingStorage.bindingStatus;
          if ((pQVar3 != (QBindingStatus *)0x0) &&
             (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
            QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data_01);
          }
          iVar11 = (data_01->super_QPropertyData<int>).val;
          if (-1 < iVar11) {
            if (pVar6 == Forward) {
              pQVar3 = (this->super_QObjectPrivate).super_QObjectData.bindingStorage.bindingStatus;
              if ((pQVar3 != (QBindingStatus *)0x0) &&
                 (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
                QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data_01);
                iVar11 = (data_01->super_QPropertyData<int>).val;
              }
              if ((pVar5 + 1) * iVar2 == iVar11 * iVar9) goto LAB_003a29ab;
            }
            else if (pVar6 == Backward && iVar2 == 0) goto LAB_003a29ab;
            goto LAB_003a29be;
          }
        }
LAB_003a29ab:
        QMetaObject::activate(obj,&QAbstractAnimation::staticMetaObject,0,(void **)0x0);
      }
      else if ((newState == Running) && (isTopLevel == true && SVar1 == Stopped)) {
        QAnimationTimer::ensureTimerUpdate();
        pVar7 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                ::value(&this->totalCurrentTime);
        QAbstractAnimation::setCurrentTime((QAbstractAnimation *)obj,pVar7);
      }
    }
  }
LAB_003a29be:
  LOCK();
  (pEVar12->weakref)._q_value.super___atomic_base<int>._M_i =
       (pEVar12->weakref)._q_value.super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pEVar12->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
    if (pEVar12 == (ExternalRefCountData *)0x0) {
      pEVar12 = (ExternalRefCountData *)0x0;
    }
    operator_delete(pEVar12);
  }
LAB_003a29d5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractAnimationPrivate::setState(QAbstractAnimation::State newState)
{
    Q_Q(QAbstractAnimation);
    const QAbstractAnimation::State oldState = state.valueBypassingBindings();
    if (oldState == newState)
        return;

    if (loopCount == 0)
        return;

    int oldCurrentTime = currentTime;
    int oldCurrentLoop = currentLoop;
    QAbstractAnimation::Direction oldDirection = direction;

    // check if we should Rewind
    if ((newState == QAbstractAnimation::Paused || newState == QAbstractAnimation::Running)
        && oldState == QAbstractAnimation::Stopped) {
            const int oldTotalCurrentTime = totalCurrentTime;
            //here we reset the time if needed
            //we don't call setCurrentTime because this might change the way the animation
            //behaves: changing the state or changing the current value
            totalCurrentTime = currentTime = (direction == QAbstractAnimation::Forward) ?
                0 : (loopCount == -1 ? q->duration() : q->totalDuration());
            if (totalCurrentTime != oldTotalCurrentTime)
                totalCurrentTime.notify();
    }

    state.setValueBypassingBindings(newState);
    QPointer<QAbstractAnimation> guard(q);

    //(un)registration of the animation must always happen before calls to
    //virtual function (updateState) to ensure a correct state of the timer
    bool isTopLevel = !group || group->state() == QAbstractAnimation::Stopped;
    if (oldState == QAbstractAnimation::Running) {
        if (newState == QAbstractAnimation::Paused && hasRegisteredTimer)
            QAnimationTimer::ensureTimerUpdate();
        //the animation, is not running any more
        QAnimationTimer::unregisterAnimation(q);
    } else if (newState == QAbstractAnimation::Running) {
        QAnimationTimer::registerAnimation(q, isTopLevel);
    }

    q->updateState(newState, oldState);
    //this is to be safe if updateState changes the state
    if (!guard || newState != state.valueBypassingBindings())
        return;

    // Notify state change
    state.notify();
    emit q->stateChanged(newState, oldState);
    //this is to be safe if updateState changes the state
    if (!guard || newState != state.valueBypassingBindings())
        return;

    switch (state) {
    case QAbstractAnimation::Paused:
        break;
    case QAbstractAnimation::Running:
        {

            // this ensures that the value is updated now that the animation is running
            if (oldState == QAbstractAnimation::Stopped) {
                if (isTopLevel) {
                    // currentTime needs to be updated if pauseTimer is active
                    QAnimationTimer::ensureTimerUpdate();
                    q->setCurrentTime(totalCurrentTime);
                }
            }
        }
        break;
    case QAbstractAnimation::Stopped:
        // Leave running state.
        int dura = q->duration();

        if (deleteWhenStopped)
            q->deleteLater();

        if (dura == -1 || loopCount < 0
            || (oldDirection == QAbstractAnimation::Forward && (oldCurrentTime * (oldCurrentLoop + 1)) == (dura * loopCount))
            || (oldDirection == QAbstractAnimation::Backward && oldCurrentTime == 0)) {
                emit q->finished();
        }
        break;
    }
}